

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_encoder_factory.h
# Opt level: O0

unique_ptr<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>_>_>
 draco::
 CreatePredictionSchemeForEncoder<int,draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>>
           (PredictionSchemeMethod method,int att_id,PointCloudEncoder *encoder,
           PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int> *transform)

{
  bool bVar1;
  int iVar2;
  PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int> *transform_00;
  PointCloudEncoder *in_RCX;
  PredictionSchemeMethod in_ESI;
  PointAttribute *in_RDI;
  uint16_t in_stack_00000026;
  Transform *in_stack_00000028;
  int in_stack_00000030;
  PredictionSchemeMethod in_stack_00000034;
  uint16_t bitstream_version;
  MeshEncoder *mesh_encoder;
  PointAttribute *att;
  unique_ptr<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>_>_>
  *ret;
  undefined4 in_stack_ffffffffffffff98;
  int32_t in_stack_ffffffffffffff9c;
  PointCloud *in_stack_ffffffffffffffa0;
  _Head_base<0UL,_draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>_*,_false>
  this;
  PredictionSchemeMethod local_c;
  
  this._M_head_impl =
       (PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>
        *)in_RDI;
  PointCloudEncoder::point_cloud(in_RCX);
  PointCloud::attribute(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  local_c = in_ESI;
  if (in_ESI == PREDICTION_UNDEFINED) {
    local_c = SelectPredictionMethod
                        ((int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                         (PointCloudEncoder *)
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  if (local_c == PREDICTION_NONE) {
    std::
    unique_ptr<draco::PredictionSchemeEncoder<int,draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>>,std::default_delete<draco::PredictionSchemeEncoder<int,draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>>>>
    ::
    unique_ptr<std::default_delete<draco::PredictionSchemeEncoder<int,draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>>>,void>
              ((unique_ptr<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>_>_>
                *)in_stack_ffffffffffffffa0,
               (nullptr_t)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  else {
    iVar2 = (*in_RCX->_vptr_PointCloudEncoder[2])();
    if (iVar2 == 1) {
      CreateMeshPredictionScheme<draco::MeshEncoder,draco::PredictionSchemeEncoder<int,draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>>,draco::MeshPredictionSchemeEncoderFactory<int>>
                (mesh_encoder,in_stack_00000034,in_stack_00000030,in_stack_00000028,
                 in_stack_00000026);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>_>_>
                          *)0x2490d8);
      if (bVar1) {
        return (__uniq_ptr_data<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>_>,_true,_true>
                )(__uniq_ptr_data<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>_>,_true,_true>
                  )this._M_head_impl;
      }
      std::
      unique_ptr<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>_>_>
      ::~unique_ptr((unique_ptr<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>_>_>
                     *)in_stack_ffffffffffffffa0);
    }
    transform_00 = (PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int> *)
                   operator_new(0x28);
    PredictionSchemeDeltaEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>
    ::PredictionSchemeDeltaEncoder
              ((PredictionSchemeDeltaEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>
                *)this._M_head_impl,in_RDI,transform_00);
    std::
    unique_ptr<draco::PredictionSchemeEncoder<int,draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>>,std::default_delete<draco::PredictionSchemeEncoder<int,draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>>>>
    ::
    unique_ptr<std::default_delete<draco::PredictionSchemeEncoder<int,draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>>>,void>
              ((unique_ptr<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>_>_>
                *)transform_00,
               (pointer)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  return (__uniq_ptr_data<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>_>,_true,_true>
          )(tuple<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>_*,_std::default_delete<draco::PredictionSchemeEncoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedEncodingTransform<int>_>_>_>
            )this._M_head_impl;
}

Assistant:

std::unique_ptr<PredictionSchemeEncoder<DataTypeT, TransformT>>
CreatePredictionSchemeForEncoder(PredictionSchemeMethod method, int att_id,
                                 const PointCloudEncoder *encoder,
                                 const TransformT &transform) {
  const PointAttribute *const att = encoder->point_cloud()->attribute(att_id);
  if (method == PREDICTION_UNDEFINED) {
    method = SelectPredictionMethod(att_id, encoder);
  }
  if (method == PREDICTION_NONE) {
    return nullptr;  // No prediction is used.
  }
  if (encoder->GetGeometryType() == TRIANGULAR_MESH) {
    // Cast the encoder to mesh encoder. This is not necessarily safe if there
    // is some other encoder decides to use TRIANGULAR_MESH as the return type,
    // but unfortunately there is not nice work around for this without using
    // RTTI (double dispatch and similar concepts will not work because of the
    // template nature of the prediction schemes).
    const MeshEncoder *const mesh_encoder =
        static_cast<const MeshEncoder *>(encoder);
    const uint16_t bitstream_version = kDracoMeshBitstreamVersion;
    auto ret = CreateMeshPredictionScheme<
        MeshEncoder, PredictionSchemeEncoder<DataTypeT, TransformT>,
        MeshPredictionSchemeEncoderFactory<DataTypeT>>(
        mesh_encoder, method, att_id, transform, bitstream_version);
    if (ret) {
      return ret;
    }
    // Otherwise try to create another prediction scheme.
  }
  // Create delta encoder.
  return std::unique_ptr<PredictionSchemeEncoder<DataTypeT, TransformT>>(
      new PredictionSchemeDeltaEncoder<DataTypeT, TransformT>(att, transform));
}